

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  bool bVar1;
  CURLcode CVar2;
  int iVar3;
  fileinfo *pfVar4;
  char *pcVar5;
  char *local_c8;
  char *p_2;
  curl_off_t fsize;
  char *p_1;
  curl_off_t hlinks;
  char *p;
  char *pcStack_98;
  uint perm;
  char *endptr;
  curl_fileinfo *finfo;
  fileinfo *infop;
  size_t sStack_78;
  char c;
  size_t len;
  char *mem;
  size_t retsize;
  Curl_easy *pCStack_58;
  CURLcode result;
  size_t i;
  ftp_parselist_data *parser;
  ftp_wc *ftpwc;
  Curl_easy *data;
  size_t bufflen;
  void *connptr_local;
  size_t nmemb_local;
  size_t size_local;
  char *buffer_local;
  
  mem = (char *)(size * nmemb);
  parser = *(ftp_parselist_data **)(*(long *)((long)connptr + 0x13c8) + 0x30);
  i = *(size_t *)parser;
  pCStack_58 = (Curl_easy *)0x0;
  ftpwc = (ftp_wc *)connptr;
  data = (Curl_easy *)mem;
  bufflen = (size_t)connptr;
  connptr_local = (void *)nmemb;
  nmemb_local = size;
  size_local = (size_t)buffer;
  if (*(int *)(i + 0xc) != 0) {
LAB_00146781:
    if (*(long *)(i + 0x10) != 0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(i + 0x10));
      *(undefined8 *)(i + 0x10) = 0;
    }
    return (size_t)mem;
  }
  if ((*(int *)i == 0) && ((Curl_easy *)mem != (Curl_easy *)0x0)) {
    bVar1 = false;
    if ('/' < *buffer) {
      bVar1 = *buffer < ':';
    }
    iVar3 = 1;
    if (bVar1) {
      iVar3 = 2;
    }
    *(int *)i = iVar3;
  }
LAB_00145172:
  if (data <= pCStack_58) {
    return (size_t)mem;
  }
  infop._7_1_ = *(char *)((long)&pCStack_58->magic + size_local);
  if (*(long *)(i + 0x10) == 0) {
    pfVar4 = Curl_fileinfo_alloc();
    *(fileinfo **)(i + 0x10) = pfVar4;
    if (*(long *)(i + 0x10) == 0) {
      *(undefined4 *)(i + 0xc) = 0x1b;
      goto LAB_00146781;
    }
    *(undefined8 *)(i + 0x20) = 0;
    *(undefined4 *)(i + 0x18) = 0;
    Curl_dyn_init((dynbuf *)(*(long *)(i + 0x10) + 0xa0),10000);
  }
  endptr = *(char **)(i + 0x10);
  finfo = (curl_fileinfo *)endptr;
  CVar2 = Curl_dyn_addn((dynbuf *)&((curl_fileinfo *)((long)endptr + 0x80))->gid,
                        (void *)((long)&infop + 7),1);
  if (CVar2 != CURLE_OK) {
    *(undefined4 *)(i + 0xc) = 0x1b;
    goto LAB_00146781;
  }
  sStack_78 = Curl_dyn_len((dynbuf *)&finfo[1].gid);
  len = (size_t)Curl_dyn_ptr((dynbuf *)&finfo[1].gid);
  if (*(int *)i == 1) {
    switch(*(undefined4 *)(i + 4)) {
    case 0:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ == 't') {
          *(undefined4 *)(i + 8) = 1;
          *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
          break;
        }
        *(undefined4 *)(i + 4) = 1;
        Curl_dyn_reset((dynbuf *)&finfo[1].gid);
        goto LAB_00145172;
      }
      if (*(int *)(i + 8) != 1) break;
      *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
      if (infop._7_1_ == '\r') {
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + -1;
        sStack_78 = sStack_78 - 1;
        Curl_dyn_setlen((dynbuf *)&finfo[1].gid,sStack_78);
      }
      else if (infop._7_1_ == '\n') {
        *(char *)(len + (*(int *)(i + 0x18) - 1)) = '\0';
        iVar3 = strncmp("total ",(char *)len,6);
        if (iVar3 != 0) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        pcStack_98 = (char *)(len + 6);
        Curl_str_passblanks(&stack0xffffffffffffff68);
        while( true ) {
          bVar1 = false;
          if ('/' < *pcStack_98) {
            bVar1 = *pcStack_98 < ':';
          }
          if (!bVar1) break;
          pcStack_98 = pcStack_98 + 1;
        }
        if (*pcStack_98 != '\0') {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(undefined4 *)(i + 4) = 1;
        Curl_dyn_reset((dynbuf *)&finfo[1].gid);
      }
      break;
    case 1:
      switch(infop._7_1_) {
      case '-':
        endptr[8] = '\0';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      default:
        *(undefined4 *)(i + 0xc) = 0x57;
        goto LAB_00146781;
      case 'D':
        endptr[8] = '\a';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 'b':
        endptr[8] = '\x03';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 'c':
        endptr[8] = '\x04';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 'd':
        endptr[8] = '\x01';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 'l':
        endptr[8] = '\x02';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 'p':
        endptr[8] = '\x05';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
        break;
      case 's':
        endptr[8] = '\x06';
        endptr[9] = '\0';
        endptr[10] = '\0';
        endptr[0xb] = '\0';
      }
      *(undefined4 *)(i + 4) = 2;
      *(undefined4 *)(i + 0x18) = 0;
      *(undefined8 *)(i + 0x20) = 1;
      break;
    case 2:
      *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
      if (*(uint *)(i + 0x18) < 10) {
        pcVar5 = strchr("rwx-tTsS",(int)infop._7_1_);
        if (pcVar5 == (char *)0x0) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
      }
      else if (*(int *)(i + 0x18) == 10) {
        if (infop._7_1_ != ' ') {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(char *)(len + 10) = '\0';
        p._4_4_ = ftp_pl_get_permission((char *)(len + *(long *)(i + 0x20)));
        if ((p._4_4_ & 0x1000000) != 0) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(uint *)(*(long *)(i + 0x10) + 0x60) = *(uint *)(*(long *)(i + 0x10) + 0x60) | 8;
        *(uint *)(*(long *)(i + 0x10) + 0x18) = p._4_4_;
        *(undefined8 *)(i + 0x48) = *(undefined8 *)(i + 0x20);
        *(undefined4 *)(i + 0x18) = 0;
        *(undefined4 *)(i + 4) = 3;
        *(undefined4 *)(i + 8) = 0;
      }
      break;
    case 3:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ != ' ') {
          if ((infop._7_1_ < '0') || ('9' < infop._7_1_)) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if (*(int *)(i + 8) == 1) {
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          hlinks = len + *(long *)(i + 0x20);
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          iVar3 = Curl_str_number((char **)&hlinks,(curl_off_t *)&p_1,0x7fffffffffffffff);
          if (iVar3 == 0) {
            *(uint *)(*(long *)(i + 0x10) + 0x60) = *(uint *)(*(long *)(i + 0x10) + 0x60) | 0x80;
            *(char **)(*(long *)(i + 0x10) + 0x30) = p_1;
          }
          *(undefined4 *)(i + 0x18) = 0;
          *(undefined8 *)(i + 0x20) = 0;
          *(undefined4 *)(i + 4) = 4;
          *(undefined4 *)(i + 8) = 0;
        }
        else if ((infop._7_1_ < '0') || ('9' < infop._7_1_)) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
      }
      break;
    case 4:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if ((*(int *)(i + 8) == 1) &&
              (*(int *)(i + 0x18) = *(int *)(i + 0x18) + 1, infop._7_1_ == ' ')) {
        *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
        *(undefined8 *)(i + 0x30) = *(undefined8 *)(i + 0x20);
        *(undefined4 *)(i + 4) = 5;
        *(undefined4 *)(i + 8) = 0;
        *(undefined8 *)(i + 0x20) = 0;
        *(undefined4 *)(i + 0x18) = 0;
      }
      break;
    case 5:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if ((*(int *)(i + 8) == 1) &&
              (*(int *)(i + 0x18) = *(int *)(i + 0x18) + 1, infop._7_1_ == ' ')) {
        *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
        *(undefined8 *)(i + 0x38) = *(undefined8 *)(i + 0x20);
        *(undefined4 *)(i + 4) = 6;
        *(undefined4 *)(i + 8) = 0;
        *(undefined8 *)(i + 0x20) = 0;
        *(undefined4 *)(i + 0x18) = 0;
      }
      break;
    case 6:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ != ' ') {
          if ((infop._7_1_ < '0') || ('9' < infop._7_1_)) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if (*(int *)(i + 8) == 1) {
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          fsize = len + *(long *)(i + 0x20);
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          iVar3 = Curl_str_numblanks((char **)&fsize,(curl_off_t *)&p_2);
          if (iVar3 == 0) {
            if ((*(char *)fsize == '\0') && (p_2 != (char *)0x7fffffffffffffff)) {
              *(uint *)(*(long *)(i + 0x10) + 0x60) = *(uint *)(*(long *)(i + 0x10) + 0x60) | 0x40;
              *(char **)(*(long *)(i + 0x10) + 0x28) = p_2;
            }
            *(undefined4 *)(i + 0x18) = 0;
            *(undefined8 *)(i + 0x20) = 0;
            *(undefined4 *)(i + 4) = 7;
            *(undefined4 *)(i + 8) = 0;
          }
        }
        else if ((infop._7_1_ < '0') || ('9' < infop._7_1_)) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
      }
      break;
    case 7:
      switch(*(undefined4 *)(i + 8)) {
      case 0:
        if (infop._7_1_ != ' ') {
          if ((((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
              ((infop._7_1_ < 'a' || ('z' < infop._7_1_)))) &&
             ((infop._7_1_ < 'A' || ('Z' < infop._7_1_)))) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
        break;
      case 1:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          *(undefined4 *)(i + 8) = 2;
        }
        else if ((((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
                 ((infop._7_1_ < 'a' || ('z' < infop._7_1_)))) &&
                (((infop._7_1_ < 'A' || ('Z' < infop._7_1_)) && (infop._7_1_ != '.')))) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        break;
      case 2:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ != ' ') {
          if (((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
             (((infop._7_1_ < 'a' || ('z' < infop._7_1_)) &&
              ((infop._7_1_ < 'A' || ('Z' < infop._7_1_)))))) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 8) = 3;
        }
        break;
      case 3:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          *(undefined4 *)(i + 8) = 4;
        }
        else if ((((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
                 ((infop._7_1_ < 'a' || ('z' < infop._7_1_)))) &&
                (((infop._7_1_ < 'A' || ('Z' < infop._7_1_)) && (infop._7_1_ != '.')))) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        break;
      case 4:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ != ' ') {
          if (((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
             (((infop._7_1_ < 'a' || ('z' < infop._7_1_)) &&
              ((infop._7_1_ < 'A' || ('Z' < infop._7_1_)))))) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 8) = 5;
        }
        break;
      case 5:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          *(undefined8 *)(i + 0x40) = *(undefined8 *)(i + 0x20);
          if (*(int *)(endptr + 8) == 2) {
            *(undefined4 *)(i + 4) = 9;
            *(undefined4 *)(i + 8) = 0;
          }
          else {
            *(undefined4 *)(i + 4) = 8;
            *(undefined4 *)(i + 8) = 0;
          }
        }
        else if ((((infop._7_1_ < '0') || ('9' < infop._7_1_)) &&
                 ((infop._7_1_ < 'a' || ('z' < infop._7_1_)))) &&
                ((((infop._7_1_ < 'A' || ('Z' < infop._7_1_)) && (infop._7_1_ != '.')) &&
                 (infop._7_1_ != ':')))) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
      }
      break;
    case 8:
      iVar3 = *(int *)(i + 8);
      if (iVar3 == 0) {
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if (iVar3 == 1) {
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == '\r') {
          *(undefined4 *)(i + 8) = 2;
        }
        else if (infop._7_1_ == '\n') {
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          *(undefined8 *)(i + 0x28) = *(undefined8 *)(i + 0x20);
          *(undefined4 *)(i + 4) = 1;
          retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
          if (retsize._4_4_ != CURLE_OK) {
            *(CURLcode *)(i + 0xc) = retsize._4_4_;
            goto LAB_00146781;
          }
        }
      }
      else if (iVar3 == 2) {
        if (infop._7_1_ != '\n') {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
        *(undefined8 *)(i + 0x28) = *(undefined8 *)(i + 0x20);
        *(undefined4 *)(i + 4) = 1;
        retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
        if (retsize._4_4_ != CURLE_OK) {
          *(CURLcode *)(i + 0xc) = retsize._4_4_;
          goto LAB_00146781;
        }
      }
      break;
    case 9:
      switch(*(undefined4 *)(i + 8)) {
      case 0:
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
        break;
      case 1:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          *(undefined4 *)(i + 8) = 2;
        }
        else if ((infop._7_1_ == '\r') || (infop._7_1_ == '\n')) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        break;
      case 2:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == '-') {
          *(undefined4 *)(i + 8) = 3;
        }
        else {
          if ((infop._7_1_ == '\r') || (infop._7_1_ == '\n')) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 8) = 1;
        }
        break;
      case 3:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == '>') {
          *(undefined4 *)(i + 8) = 4;
        }
        else {
          if ((infop._7_1_ == '\r') || (infop._7_1_ == '\n')) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 8) = 1;
        }
        break;
      case 4:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == ' ') {
          *(undefined4 *)(i + 8) = 5;
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -4) = '\0';
          *(undefined8 *)(i + 0x28) = *(undefined8 *)(i + 0x20);
          *(undefined4 *)(i + 0x18) = 0;
          *(undefined8 *)(i + 0x20) = 0;
        }
        else {
          if ((infop._7_1_ == '\r') || (infop._7_1_ == '\n')) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 8) = 1;
        }
        break;
      case 5:
        if ((infop._7_1_ == '\r') || (infop._7_1_ == '\n')) {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(undefined4 *)(i + 8) = 6;
        *(size_t *)(i + 0x20) = sStack_78 - 1;
        *(undefined4 *)(i + 0x18) = 1;
        break;
      case 6:
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == '\r') {
          *(undefined4 *)(i + 8) = 7;
        }
        else if (infop._7_1_ == '\n') {
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          *(undefined8 *)(i + 0x50) = *(undefined8 *)(i + 0x20);
          retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
          if (retsize._4_4_ != CURLE_OK) {
            *(CURLcode *)(i + 0xc) = retsize._4_4_;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 4) = 1;
        }
        break;
      case 7:
        if (infop._7_1_ != '\n') {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
        *(undefined8 *)(i + 0x50) = *(undefined8 *)(i + 0x20);
        retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
        if (retsize._4_4_ != CURLE_OK) {
          *(CURLcode *)(i + 0xc) = retsize._4_4_;
          goto LAB_00146781;
        }
        *(undefined4 *)(i + 4) = 1;
      }
    }
  }
  else {
    if (*(int *)i != 2) {
      mem = (char *)((long)&data->magic + 1);
      goto LAB_00146781;
    }
    switch(*(undefined4 *)(i + 4)) {
    case 0:
      *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
      if (*(uint *)(i + 0x18) < 9) {
        pcVar5 = strchr("0123456789-",(int)infop._7_1_);
        if (pcVar5 != (char *)0x0) break;
        *(undefined4 *)(i + 0xc) = 0x57;
        goto LAB_00146781;
      }
      if (*(int *)(i + 0x18) != 9) {
        *(undefined4 *)(i + 0xc) = 0x57;
        goto LAB_00146781;
      }
      if (infop._7_1_ != ' ') {
        *(undefined4 *)(i + 0xc) = 0x57;
        goto LAB_00146781;
      }
      *(undefined4 *)(i + 4) = 1;
      *(undefined4 *)(i + 8) = 0;
      break;
    case 1:
      *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
      if (*(int *)(i + 8) == 0) {
        if ((infop._7_1_ != ' ') && (infop._7_1_ != '\t')) {
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if (*(int *)(i + 8) == 1) {
        if (infop._7_1_ == ' ') {
          *(undefined8 *)(i + 0x40) = *(undefined8 *)(i + 0x20);
          *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
          *(undefined4 *)(i + 4) = 2;
          *(undefined4 *)(i + 8) = 0;
          *(undefined4 *)(i + 0x18) = 0;
        }
        else {
          pcVar5 = strchr("APM0123456789:",(int)infop._7_1_);
          if (pcVar5 == (char *)0x0) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
        }
      }
      break;
    case 2:
      if (*(int *)(i + 8) == 0) {
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if ((*(int *)(i + 8) == 1) &&
              (*(int *)(i + 0x18) = *(int *)(i + 0x18) + 1, infop._7_1_ == ' ')) {
        *(char *)(len + *(long *)(i + 0x20) + (ulong)*(uint *)(i + 0x18) + -1) = '\0';
        iVar3 = strcmp("<DIR>",(char *)(len + *(long *)(i + 0x20)));
        if (iVar3 == 0) {
          endptr[8] = '\x01';
          endptr[9] = '\0';
          endptr[10] = '\0';
          endptr[0xb] = '\0';
          endptr[0x28] = '\0';
          endptr[0x29] = '\0';
          endptr[0x2a] = '\0';
          endptr[0x2b] = '\0';
          endptr[0x2c] = '\0';
          endptr[0x2d] = '\0';
          endptr[0x2e] = '\0';
          endptr[0x2f] = '\0';
        }
        else {
          local_c8 = (char *)(len + *(long *)(i + 0x20));
          iVar3 = Curl_str_numblanks(&local_c8,(curl_off_t *)(endptr + 0x28));
          if (iVar3 != 0) {
            *(undefined4 *)(i + 0xc) = 0x57;
            goto LAB_00146781;
          }
          *(undefined4 *)(*(long *)(i + 0x10) + 8) = 0;
        }
        *(uint *)(*(long *)(i + 0x10) + 0x60) = *(uint *)(*(long *)(i + 0x10) + 0x60) | 0x40;
        *(undefined4 *)(i + 0x18) = 0;
        *(undefined4 *)(i + 4) = 3;
        *(undefined4 *)(i + 8) = 0;
      }
      break;
    case 3:
      iVar3 = *(int *)(i + 8);
      if (iVar3 == 0) {
        if (infop._7_1_ != ' ') {
          *(size_t *)(i + 0x20) = sStack_78 - 1;
          *(undefined4 *)(i + 0x18) = 1;
          *(undefined4 *)(i + 8) = 1;
        }
      }
      else if (iVar3 == 1) {
        *(int *)(i + 0x18) = *(int *)(i + 0x18) + 1;
        if (infop._7_1_ == '\r') {
          *(undefined4 *)(i + 8) = 2;
          *(char *)(len + (sStack_78 - 1)) = '\0';
        }
        else if (infop._7_1_ == '\n') {
          *(undefined8 *)(i + 0x28) = *(undefined8 *)(i + 0x20);
          *(char *)(len + (sStack_78 - 1)) = '\0';
          retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
          if (retsize._4_4_ != CURLE_OK) {
            *(CURLcode *)(i + 0xc) = retsize._4_4_;
            goto LAB_00146781;
          }
          *(undefined4 *)(i + 4) = 0;
          *(undefined4 *)(i + 8) = 0;
        }
      }
      else if (iVar3 == 2) {
        if (infop._7_1_ != '\n') {
          *(undefined4 *)(i + 0xc) = 0x57;
          goto LAB_00146781;
        }
        *(undefined8 *)(i + 0x28) = *(undefined8 *)(i + 0x20);
        retsize._4_4_ = ftp_pl_insert_finfo((Curl_easy *)ftpwc,(fileinfo *)finfo);
        if (retsize._4_4_ != CURLE_OK) {
          *(CURLcode *)(i + 0xc) = retsize._4_4_;
          goto LAB_00146781;
        }
        *(undefined4 *)(i + 4) = 0;
        *(undefined4 *)(i + 8) = 0;
      }
    }
  }
  pCStack_58 = (Curl_easy *)((long)&pCStack_58->magic + 1);
  goto LAB_00145172;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              const char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              Curl_str_passblanks(&endptr);
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            const char *p = &mem[parser->item_offset];
            curl_off_t hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;

            if(!Curl_str_number(&p, &hlinks, LONG_MAX)) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = (long)hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            const char *p = mem + parser->item_offset;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!Curl_str_numblanks(&p, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              const char *p = mem + parser->item_offset;
              if(Curl_str_numblanks(&p, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}